

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
::grow(SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
       *this,uint AtLeast)

{
  ushort uVar1;
  uint uVar2;
  uint64_t uVar3;
  LargeRep *pLVar4;
  DenseSetPair<unsigned_short> *pDVar5;
  long lVar6;
  DenseSetPair<unsigned_short> *pDVar7;
  LargeRep LVar8;
  DenseSetPair<unsigned_short> local_38 [4];
  AlignedCharArrayUnion<llvm::detail::DenseSetPair<unsigned_short>[4]> TmpStorage;
  
  if (3 < AtLeast) {
    uVar3 = NextPowerOf2((ulong)(AtLeast - 1));
    AtLeast = 0x40;
    if (0x40 < (uint)uVar3) {
      AtLeast = (uint)uVar3;
    }
  }
  if ((undefined1  [24])((undefined1  [24])*this & (undefined1  [24])0x1) == (undefined1  [24])0x0)
  {
    pLVar4 = getLargeRep(this);
    pDVar7 = pLVar4->Buckets;
    uVar2 = pLVar4->NumBuckets;
    getLargeRep(this);
    if (AtLeast < 5) {
      *(byte *)this = *(byte *)this | 1;
    }
    else {
      pLVar4 = getLargeRep(this);
      LVar8 = allocateBuckets(this,AtLeast);
      pLVar4->Buckets = LVar8.Buckets;
      pLVar4->NumBuckets = LVar8.NumBuckets;
    }
    DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
    ::moveFromOldBuckets
              ((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                *)this,pDVar7,pDVar7 + uVar2);
    operator_delete(pDVar7,(ulong)uVar2 * 2,2);
    return;
  }
  if (3 < AtLeast) {
    pDVar5 = getBuckets(this);
    pDVar7 = local_38;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 2) {
      uVar1 = *(ushort *)((long)&pDVar5->key + lVar6);
      if (uVar1 < 0xfffe) {
        if (7 < (ulong)((long)pDVar7 - (long)local_38)) {
          __assert_fail("size_t(TmpEnd - TmpBegin) < InlineBuckets && \"Too many inline buckets!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                        ,0x405,
                        "void llvm::SmallDenseMap<unsigned short, llvm::detail::DenseSetEmpty, 4, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>::grow(unsigned int) [KeyT = unsigned short, ValueT = llvm::detail::DenseSetEmpty, InlineBuckets = 4, KeyInfoT = llvm::DenseMapInfo<unsigned short>, BucketT = llvm::detail::DenseSetPair<unsigned short>]"
                       );
        }
        pDVar7->key = uVar1;
        pDVar7 = pDVar7 + 1;
      }
    }
    *(byte *)this = *(byte *)this & 0xfe;
    pLVar4 = getLargeRep(this);
    LVar8 = allocateBuckets(this,AtLeast);
    pLVar4->Buckets = LVar8.Buckets;
    pLVar4->NumBuckets = LVar8.NumBuckets;
    DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
    ::moveFromOldBuckets
              ((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                *)this,local_38,pDVar7);
  }
  return;
}

Assistant:

void grow(unsigned AtLeast) {
    if (AtLeast >= InlineBuckets)
      AtLeast = std::max<unsigned>(64, NextPowerOf2(AtLeast-1));

    if (Small) {
      if (AtLeast < InlineBuckets)
        return; // Nothing to do.

      // First move the inline buckets into a temporary storage.
      AlignedCharArrayUnion<BucketT[InlineBuckets]> TmpStorage;
      BucketT *TmpBegin = reinterpret_cast<BucketT *>(TmpStorage.buffer);
      BucketT *TmpEnd = TmpBegin;

      // Loop over the buckets, moving non-empty, non-tombstones into the
      // temporary storage. Have the loop move the TmpEnd forward as it goes.
      const KeyT EmptyKey = this->getEmptyKey();
      const KeyT TombstoneKey = this->getTombstoneKey();
      for (BucketT *P = getBuckets(), *E = P + InlineBuckets; P != E; ++P) {
        if (!KeyInfoT::isEqual(P->getFirst(), EmptyKey) &&
            !KeyInfoT::isEqual(P->getFirst(), TombstoneKey)) {
          assert(size_t(TmpEnd - TmpBegin) < InlineBuckets &&
                 "Too many inline buckets!");
          ::new (&TmpEnd->getFirst()) KeyT(std::move(P->getFirst()));
          ::new (&TmpEnd->getSecond()) ValueT(std::move(P->getSecond()));
          ++TmpEnd;
          P->getSecond().~ValueT();
        }
        P->getFirst().~KeyT();
      }

      // Now make this map use the large rep, and move all the entries back
      // into it.
      Small = false;
      new (getLargeRep()) LargeRep(allocateBuckets(AtLeast));
      this->moveFromOldBuckets(TmpBegin, TmpEnd);
      return;
    }

    LargeRep OldRep = std::move(*getLargeRep());
    getLargeRep()->~LargeRep();
    if (AtLeast <= InlineBuckets) {
      Small = true;
    } else {
      new (getLargeRep()) LargeRep(allocateBuckets(AtLeast));
    }

    this->moveFromOldBuckets(OldRep.Buckets, OldRep.Buckets+OldRep.NumBuckets);

    // Free the old table.
    deallocate_buffer(OldRep.Buckets, sizeof(BucketT) * OldRep.NumBuckets,
                      alignof(BucketT));
  }